

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O1

void __thiscall
wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::erase
          (InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_> *this,Block **k)

{
  __node_base_ptr p_Var1;
  _Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_false>
  __it;
  
  __it._M_cur = (__node_type *)0x0;
  p_Var1 = std::
           _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)this,(ulong)*k % (this->Map)._M_h._M_bucket_count,k,(__hash_code)*k);
  if (p_Var1 != (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)p_Var1->_M_nxt;
  }
  if (__it._M_cur != (__node_type *)0x0) {
    std::__cxx11::
    list<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>
    ::_M_erase(&this->List,*(_List_node_base **)((long)__it._M_cur + 0x10));
    std::
    _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)this,(const_iterator)__it._M_cur);
    return;
  }
  return;
}

Assistant:

void erase(const Key& k) {
    auto it = Map.find(k);
    if (it != Map.end()) {
      List.erase(it->second);
      Map.erase(it);
    }
  }